

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpirvIntrinsics.cpp
# Opt level: O0

void __thiscall
glslang::TIntermediate::insertSpirvExecutionModeId
          (TIntermediate *this,int executionMode,TIntermAggregate *args)

{
  bool bVar1;
  int iVar2;
  TSpirvExecutionMode *this_00;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_01;
  reference ppTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *this_02;
  undefined4 in_register_00000034;
  bool local_79;
  value_type local_68;
  TIntermTyped *extraOperand;
  TIntermNode *arg;
  const_iterator __end1;
  const_iterator __begin1;
  TIntermSequence *__range1;
  TVector<const_glslang::TIntermTyped_*> extraOperands;
  TIntermAggregate *args_local;
  TIntermediate *pTStack_10;
  int executionMode_local;
  TIntermediate *this_local;
  
  extraOperands.
  super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  .
  super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)args;
  args_local._4_4_ = executionMode;
  pTStack_10 = this;
  if (this->spirvExecutionMode == (TSpirvExecutionMode *)0x0) {
    this_00 = (TSpirvExecutionMode *)
              TSpirvExecutionMode::operator_new
                        ((TSpirvExecutionMode *)0x70,CONCAT44(in_register_00000034,executionMode));
    TSpirvExecutionMode::TSpirvExecutionMode(this_00);
    this->spirvExecutionMode = this_00;
  }
  if (extraOperands.
      super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
      .
      super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    TVector<const_glslang::TIntermTyped_*>::TVector
              ((TVector<const_glslang::TIntermTyped_*> *)&__range1);
    this_01 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
              (**(code **)&(*extraOperands.
                             super_vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                             .
                             super__Vector_base<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)[2].type.field_0x8)
                        ();
    __end1 = std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::begin(this_01);
    arg = (TIntermNode *)
          std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::end(this_01);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                  *)&arg);
      if (!bVar1) {
        this_02 = std::
                  map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                  ::operator[](&(this->spirvExecutionMode->modeIds).
                                super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                               ,(key_type_conflict1 *)((long)&args_local + 4));
        TVector<const_glslang::TIntermTyped_*>::operator=
                  (this_02,(TVector<const_glslang::TIntermTyped_*> *)&__range1);
        TVector<const_glslang::TIntermTyped_*>::~TVector
                  ((TVector<const_glslang::TIntermTyped_*> *)&__range1);
        return;
      }
      ppTVar3 = __gnu_cxx::
                __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                ::operator*(&__end1);
      extraOperand = (TIntermTyped *)*ppTVar3;
      iVar2 = (*(extraOperand->super_TIntermNode)._vptr_TIntermNode[3])();
      local_68 = (value_type)CONCAT44(extraout_var,iVar2);
      local_79 = false;
      if (local_68 != (value_type)0x0) {
        iVar2 = (*(local_68->super_TIntermNode)._vptr_TIntermNode[0x21])();
        local_79 = TQualifier::isConstant((TQualifier *)CONCAT44(extraout_var_00,iVar2));
      }
      if (local_79 == false) break;
      std::
      vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
      ::push_back((vector<const_glslang::TIntermTyped_*,_glslang::pool_allocator<const_glslang::TIntermTyped_*>_>
                   *)&__range1,&local_68);
      __gnu_cxx::
      __normal_iterator<TIntermNode_*const_*,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
      ::operator++(&__end1);
    }
    __assert_fail("extraOperand != nullptr && extraOperand->getQualifier().isConstant()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                  ,0x90,
                  "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
                 );
  }
  __assert_fail("args",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SpirvIntrinsics.cpp"
                ,0x8b,
                "void glslang::TIntermediate::insertSpirvExecutionModeId(int, const TIntermAggregate *)"
               );
}

Assistant:

void TIntermediate::insertSpirvExecutionModeId(int executionMode, const TIntermAggregate* args)
{
    if (!spirvExecutionMode)
        spirvExecutionMode = new TSpirvExecutionMode;

    assert(args);
    TVector<const TIntermTyped*> extraOperands;

    for (auto arg : args->getSequence()) {
        auto extraOperand = arg->getAsTyped();
        assert(extraOperand != nullptr && extraOperand->getQualifier().isConstant());
        extraOperands.push_back(extraOperand);
    }
    spirvExecutionMode->modeIds[executionMode] = extraOperands;
}